

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * GenImageChecked(Image *__return_storage_ptr__,int width,int height,int checksX,int checksY,
                       Color col1,Color col2)

{
  Color CVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  pvVar2 = malloc((long)(height * width) << 2);
  if (0 < height) {
    uVar4 = 0;
    pvVar3 = pvVar2;
    do {
      if (0 < width) {
        uVar5 = 0;
        do {
          CVar1 = col2;
          if (((int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                    (long)checksX) +
               (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                    (long)checksY) & 1U) == 0) {
            CVar1 = col1;
          }
          *(Color *)((long)pvVar3 + uVar5 * 4) = CVar1;
          uVar5 = uVar5 + 1;
        } while ((uint)width != uVar5);
      }
      uVar4 = uVar4 + 1;
      pvVar3 = (void *)((long)pvVar3 + (ulong)(uint)width * 4);
    } while (uVar4 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageChecked(int width, int height, int checksX, int checksY, Color col1, Color col2)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            if ((x/checksX + y/checksY)%2 == 0) pixels[y*width + x] = col1;
            else pixels[y*width + x] = col2;
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}